

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairList.cpp
# Opt level: O2

int * __thiscall OpenMD::PairList::getPairList(PairList *this)

{
  pointer piVar1;
  int *piVar2;
  undefined8 in_RAX;
  _Base_ptr p_Var3;
  int *piVar4;
  undefined8 local_38;
  
  if (this->modified_ == true) {
    piVar1 = (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar1) {
      (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar1;
    }
    local_38 = in_RAX;
    for (p_Var3 = (this->pairSet_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->pairSet_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      local_38._4_4_ = p_Var3[1]._M_color + _S_black;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&this->pairList_,(int *)((long)&local_38 + 4));
      local_38 = CONCAT44(local_38._4_4_,*(int *)&p_Var3[1].field_0x4 + 1);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->pairList_,(int *)&local_38);
    }
    this->modified_ = false;
  }
  piVar2 = (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (int *)0x0;
  if (piVar2 != (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    piVar4 = piVar2;
  }
  return piVar4;
}

Assistant:

int* PairList::getPairList() {
    if (modified_) {
      pairList_.clear();

      for (std::set<std::pair<int, int>>::iterator i = pairSet_.begin();
           i != pairSet_.end(); ++i) {
        pairList_.push_back(i->first + 1);
        pairList_.push_back(i->second + 1);
      }
      modified_ = false;
    }

    return pairList_.empty() ? NULL : &(pairList_[0]);
  }